

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O0

void __thiscall DSDcc::DSDNXDN::processVoiceFrameEFR(DSDNXDN *this,int symbolIndex,int dibit)

{
  DSDLogger *pDVar1;
  int in_ESI;
  long *in_RDI;
  double __x;
  double __x_00;
  DSDNXDN *unaff_retaddr;
  long *plVar2;
  
  plVar2 = in_RDI;
  if ((in_ESI == 0) && (*(int *)(*in_RDI + 4) == 1)) {
    pDVar1 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
    DSDLogger::log(pDVar1,__x);
  }
  storeSymbolDV(unaff_retaddr,(int)((ulong)plVar2 >> 0x20),(uchar)((ulong)plVar2 >> 0x18),
                SUB81((ulong)plVar2 >> 0x10,0));
  if ((in_ESI % 0x48 == 0x47) &&
     (*(undefined1 *)(*in_RDI + 0x701f2) = 1, *(int *)(*in_RDI + 4) == 1)) {
    pDVar1 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
    DSDLogger::log(pDVar1,__x_00);
  }
  return;
}

Assistant:

void DSDNXDN::processVoiceFrameEFR(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    storeSymbolDV(symbolIndex % 72, dibit);

    if (symbolIndex % 72 == 71)
    {
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}